

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::GreaterThan,true,false,true,false>
                (hugeint_t *ldata,hugeint_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  hugeint_t *phVar9;
  idx_t iVar10;
  ulong uVar11;
  
  uVar5 = 0;
  iVar10 = 0;
  uVar8 = 0;
  do {
    if (uVar5 == count + 0x3f >> 6) {
      return iVar10;
    }
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    if (puVar1 == (unsigned_long *)0x0) {
      uVar6 = uVar8 + 0x40;
      if (count <= uVar8 + 0x40) {
        uVar6 = count;
      }
LAB_013de584:
      phVar9 = rdata + uVar8;
      for (uVar11 = uVar8; uVar11 < uVar6; uVar11 = uVar11 + 1) {
        uVar8 = uVar11;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)sel->sel_vector[uVar11];
        }
        bVar3 = GreaterThan::Operation<duckdb::hugeint_t>(ldata,phVar9);
        true_sel->sel_vector[iVar10] = (sel_t)uVar8;
        iVar10 = iVar10 + bVar3;
        phVar9 = phVar9 + 1;
      }
    }
    else {
      uVar2 = puVar1[uVar5];
      uVar6 = uVar8 + 0x40;
      if (count <= uVar8 + 0x40) {
        uVar6 = count;
      }
      if (uVar2 == 0xffffffffffffffff) goto LAB_013de584;
      uVar11 = uVar6;
      if (uVar2 != 0) {
        phVar9 = rdata + uVar8;
        uVar7 = 0;
        for (uVar11 = uVar8; uVar11 < uVar6; uVar11 = uVar11 + 1) {
          uVar8 = uVar11;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar8 = (ulong)sel->sel_vector[uVar11];
          }
          if ((uVar2 >> (uVar7 & 0x3f) & 1) == 0) {
            uVar4 = 0;
          }
          else {
            bVar3 = GreaterThan::Operation<duckdb::hugeint_t>(ldata,phVar9);
            uVar4 = (ulong)bVar3;
          }
          true_sel->sel_vector[iVar10] = (sel_t)uVar8;
          iVar10 = iVar10 + uVar4;
          uVar7 = uVar7 + 1;
          phVar9 = phVar9 + 1;
        }
      }
    }
    uVar5 = uVar5 + 1;
    uVar8 = uVar11;
  } while( true );
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}